

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Reader::Init(BP5Reader *this)

{
  float fVar1;
  float fVar2;
  Mode MVar3;
  IO *pIVar4;
  char *pcVar5;
  TimePoint TVar6;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  pointer local_b0;
  pointer local_a8;
  Seconds timeoutSeconds;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  TimePoint timeoutInstant;
  string local_40;
  
  MVar3 = (this->super_Engine).m_OpenMode;
  if ((MVar3 != Read) && (MVar3 != ReadRandomAccess)) {
    std::__cxx11::string::string((string *)&timeoutSeconds,"Engine",&local_b1);
    std::__cxx11::string::string((string *)&local_40,"BP5Reader",&local_b2);
    std::__cxx11::string::string((string *)&timeoutInstant,"Init",&local_b3);
    std::operator+(&local_80,
                   "BPFileReader only supports OpenMode::Read or OpenMode::ReadRandomAccess from",
                   &(this->super_Engine).m_Name);
    helper::Throw<std::invalid_argument>
              ((string *)&timeoutSeconds,&local_40,(string *)&timeoutInstant,&local_80,-1);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&timeoutInstant);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&timeoutSeconds);
  }
  pIVar4 = (this->super_Engine).m_IO;
  pIVar4->m_ReadStreaming = false;
  this->m_ReaderIsRowMajor = pIVar4->m_ArrayOrder == RowMajor;
  (*(this->super_Engine)._vptr_Engine[0x16])(this);
  (*(this->super_Engine)._vptr_Engine[0x17])(this);
  if ((this->super_BP5Engine).m_Parameters.SelectSteps._M_string_length != 0) {
    helper::RangeFilter::ParseSelection
              (&this->m_SelectedSteps,&(this->super_BP5Engine).m_Parameters.SelectSteps);
  }
  if (this->m_ReadMetadataFromFile == true) {
    fVar1 = (this->super_BP5Engine).m_Parameters.OpenTimeoutSecs;
    local_a8 = (pointer)(double)fVar1;
    fVar2 = (this->super_BP5Engine).m_Parameters.BeginStepPollingFrequencySecs;
    local_b0 = local_a8;
    if (fVar2 <= fVar1) {
      local_b0 = (pointer)(double)fVar2;
    }
    timeoutSeconds.__r = (rep_conflict)local_a8;
    local_40._M_dataplus._M_p = local_b0;
    TVar6 = Now();
    timeoutInstant.__d.__r = (duration)((double)local_a8 * 1000000000.0 + (double)TVar6.__d.__r);
    OpenFiles(this,&timeoutInstant,(Seconds *)&local_40,&timeoutSeconds);
    local_80._M_dataplus._M_p = (pointer)(local_b0 / 10.0);
    UpdateBuffer(this,&timeoutInstant,(Seconds *)&local_80,&timeoutSeconds);
    if ((this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length != 0) {
      this->m_dataIsRemote = true;
    }
    pcVar5 = getenv("DoRemote");
    if ((pcVar5 == (char *)0x0) && (pcVar5 = getenv("DoXRootD"), pcVar5 == (char *)0x0)) {
      return;
    }
    this->m_dataIsRemote = true;
  }
  return;
}

Assistant:

void BP5Reader::Init()
{
    if ((m_OpenMode != Mode::Read) && (m_OpenMode != Mode::ReadRandomAccess))
    {
        helper::Throw<std::invalid_argument>("Engine", "BP5Reader", "Init",
                                             "BPFileReader only supports OpenMode::Read or "
                                             "OpenMode::ReadRandomAccess from" +
                                                 m_Name);
    }

    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;
    m_ReaderIsRowMajor = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);
    InitParameters();
    InitTransports();
    if (!m_Parameters.SelectSteps.empty())
    {
        m_SelectedSteps.ParseSelection(m_Parameters.SelectSteps);
    }

    if (m_ReadMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds = Seconds(m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;
        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);

        // Don't try to open the remote file when we open local metadata.  Do that on demand.
        if (!m_Parameters.RemoteDataPath.empty())
            m_dataIsRemote = true;
        if (getenv("DoRemote") || getenv("DoXRootD"))
            m_dataIsRemote = true;
    }
}